

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O2

void __thiscall
Atari2600::TIA::Missile::output_pixels
          (Missile *this,uint8_t *target,int count,uint8_t collision_identity,
          int from_horizontal_counter)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (this->super_HorizontalRun).pixel_position;
  if (iVar1 != 0) {
    if (((this->super_HorizontalRun).field_0x1d == '\x01') &&
       ((this->super_HorizontalRun).field_0x1e == '\0')) {
      HorizontalRun::output_pixels
                (&this->super_HorizontalRun,target,count,collision_identity,from_horizontal_counter)
      ;
      return;
    }
    iVar1 = iVar1 - count;
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    (this->super_HorizontalRun).pixel_position = iVar2;
  }
  return;
}

Assistant:

inline void output_pixels(uint8_t *const target, const int count, const uint8_t collision_identity, int from_horizontal_counter) {
				if(!pixel_position) return;
				if(enabled && !locked_to_player) {
					HorizontalRun::output_pixels(target, count, collision_identity, from_horizontal_counter);
				} else {
					skip_pixels(count, from_horizontal_counter);
				}
			}